

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void run_bitset_container_lazy_xor
               (run_container_t *src_1,bitset_container_t *src_2,bitset_container_t *dst)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  rle16_t *prVar4;
  uint64_t *puVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  
  if (src_2 != dst) {
    dst->cardinality = src_2->cardinality;
    memcpy(dst->words,src_2->words,0x2000);
  }
  iVar3 = src_1->n_runs;
  if (0 < (long)iVar3) {
    prVar4 = src_1->runs;
    puVar5 = dst->words;
    lVar8 = 0;
    do {
      uVar1 = prVar4[lVar8].value;
      uVar2 = prVar4[lVar8].length;
      if ((uint)uVar2 + (uint)uVar1 + 1 != (uint)uVar1) {
        uVar6 = (uint)uVar2 + (uint)uVar1;
        uVar9 = (ulong)(uint)(uVar1 >> 6);
        uVar7 = uVar6 >> 6;
        puVar5[uVar9] = ~(-1L << ((byte)uVar1 & 0x3f) ^ puVar5[uVar9]);
        if (uVar1 >> 6 < uVar7) {
          do {
            puVar5[uVar9] = ~puVar5[uVar9];
            uVar9 = uVar9 + 1;
          } while (uVar7 != uVar9);
        }
        puVar5[uVar7] = puVar5[uVar7] ^ 0xffffffffffffffffU >> (~(byte)uVar6 & 0x3f);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != iVar3);
  }
  dst->cardinality = -1;
  return;
}

Assistant:

void run_bitset_container_lazy_xor(const run_container_t *src_1,
                                   const bitset_container_t *src_2,
                                   bitset_container_t *dst) {
    if (src_2 != dst) bitset_container_copy(src_2, dst);
    for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
        rle16_t rle = src_1->runs[rlepos];
        bitset_flip_range(dst->words, rle.value,
                          rle.value + rle.length + UINT32_C(1));
    }
    dst->cardinality = BITSET_UNKNOWN_CARDINALITY;
}